

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O1

bool __thiscall
Am_Object_Data::propagate_change
          (Am_Object_Data *this,Am_Slot_Key key,Am_Constraint *cause,Am_Value *old_value,
          Am_Value *new_value)

{
  bool bVar1;
  bool bVar2;
  Am_Object_Data *this_00;
  
  this_00 = this->first_instance;
  if (this_00 == (Am_Object_Data *)0x0) {
    bVar2 = true;
  }
  else {
    bVar2 = true;
    do {
      bVar1 = notify_change(this_00,key,cause,old_value,new_value);
      bVar2 = (bool)(bVar2 & bVar1);
      this_00 = this_00->next_instance;
    } while (this_00 != (Am_Object_Data *)0x0);
  }
  return bVar2;
}

Assistant:

bool
Am_Object_Data::propagate_change(Am_Slot_Key key, Am_Constraint *cause,
                                 const Am_Value &old_value,
                                 const Am_Value &new_value)
{
#ifdef DEBUG
  Global_Reason_Why_Set |= Am_TRACE_INHERITANCE_PROPAGATION;
#endif
  bool no_inherit = true;
  Am_Object_Data *current = first_instance;
  while (current) {
    no_inherit =
        current->notify_change(key, cause, old_value, new_value) && no_inherit;
    current = current->next_instance;
  }
#ifdef DEBUG
  Global_Reason_Why_Set &= ~Am_TRACE_INHERITANCE_PROPAGATION;
#endif
  return no_inherit;
}